

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::SearchRE2(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  bool bVar1;
  string *__lhs;
  ostream *poVar2;
  LogMessage local_5a0;
  LogMessage local_420;
  LogMessage local_2a0;
  undefined1 local_110 [8];
  RE2 re;
  int i;
  bool expect_match_local;
  Anchor anchor_local;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  for (re.group_names_once_._M_once = 0; re.group_names_once_._M_once < iters;
      re.group_names_once_._M_once = re.group_names_once_._M_once + 1) {
    RE2::RE2((RE2 *)local_110,regexp);
    __lhs = RE2::error_abi_cxx11_((RE2 *)local_110);
    bVar1 = std::operator==(__lhs,"");
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_2a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x3b7);
      poVar2 = LogMessage::stream(&local_2a0);
      std::operator<<(poVar2,"Check failed: (re.error()) == (\"\")");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2a0);
    }
    if (anchor == kAnchored) {
      bVar1 = RE2::FullMatch<>(text,(RE2 *)local_110);
      if (bVar1 != expect_match) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_420,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3b9);
        poVar2 = LogMessage::stream(&local_420);
        std::operator<<(poVar2,"Check failed: (RE2::FullMatch(text, re)) == (expect_match)");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_420);
      }
    }
    else {
      bVar1 = RE2::PartialMatch<>(text,(RE2 *)local_110);
      if (bVar1 != expect_match) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_5a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3bb);
        poVar2 = LogMessage::stream(&local_5a0);
        std::operator<<(poVar2,"Check failed: (RE2::PartialMatch(text, re)) == (expect_match)");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5a0);
      }
    }
    RE2::~RE2((RE2 *)local_110);
  }
  return;
}

Assistant:

void SearchRE2(int iters, const char* regexp, const StringPiece& text,
               Prog::Anchor anchor, bool expect_match) {
  for (int i = 0; i < iters; i++) {
    RE2 re(regexp);
    CHECK_EQ(re.error(), "");
    if (anchor == Prog::kAnchored)
      CHECK_EQ(RE2::FullMatch(text, re), expect_match);
    else
      CHECK_EQ(RE2::PartialMatch(text, re), expect_match);
  }
}